

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O0

int av1_intrabc_hash_search
              (AV1_COMP *cpi,MACROBLOCKD *xd,FULLPEL_MOTION_SEARCH_PARAMS *ms_params,
              IntraBCHashInfo *intrabc_hash_info,FULLPEL_MV *best_mv)

{
  byte bVar1;
  undefined8 uVar2;
  int iVar3;
  uint uVar4;
  uint stride;
  int iVar5;
  int iVar6;
  int32_t iVar7;
  int iVar8;
  int iVar9;
  FullMvLimits *mv_limits_00;
  uint32_t *hash_value2_00;
  hash_table *p_hash_table;
  undefined8 *puVar10;
  long in_RCX;
  byte *in_RDX;
  MACROBLOCKD *in_RSI;
  IntraBCHashInfo *in_R8;
  Iterator IVar11;
  int refCost;
  FULLPEL_MV_STATS mv_stats;
  FULLPEL_MV hash_mv;
  MV dv;
  block_hash ref_block_hash;
  int i;
  Iterator iterator;
  int count;
  hash_table *ref_frame_hash;
  int best_hash_cost;
  uint32_t hash_value2;
  uint32_t hash_value1;
  int y_pos;
  int x_pos;
  int mi_col;
  int mi_row;
  int src_stride;
  uint8_t *src;
  MSBuffers *ms_buffer;
  FullMvLimits *mv_limits;
  int block_height;
  int block_width;
  BLOCK_SIZE bsize;
  uint32_t in_stack_ffffffffffffff1c;
  AV1_COMP *in_stack_ffffffffffffff20;
  FULLPEL_MV local_ac;
  short local_a4;
  short sStack_a2;
  int iVar12;
  int in_stack_ffffffffffffff8c;
  uint32_t in_stack_ffffffffffffff90;
  MV dv_00;
  int in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 uVar13;
  int local_4;
  
  iVar3 = av1_use_hash_me(in_stack_ffffffffffffff20);
  if (iVar3 == 0) {
    local_4 = 0x7fffffff;
  }
  else {
    bVar1 = *in_RDX;
    uVar13 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffffcc);
    uVar4 = (uint)block_size_wide[bVar1];
    stride = (uint)block_size_high[bVar1];
    if (uVar4 == stride) {
      mv_limits_00 = (FullMvLimits *)(in_RDX + 0x58);
      hash_value2_00 = (uint32_t *)(in_RDX + 0x10);
      dv_00 = (MV)in_RSI->mi_row;
      iVar3 = in_RSI->mi_col;
      iVar5 = iVar3 << 2;
      iVar6 = (int)dv_00 << 2;
      local_4 = 0x7fffffff;
      p_hash_table = (hash_table *)(in_RCX + 0x20);
      is_cur_buf_hbd(in_RSI);
      av1_get_block_hash_value
                (in_R8,(uint8_t *)CONCAT44(uVar13,uVar4),stride,in_stack_ffffffffffffffc0,
                 (uint32_t *)mv_limits_00,hash_value2_00,(int)in_RDX);
      iVar7 = av1_hash_table_count(p_hash_table,in_stack_ffffffffffffff90);
      if (iVar7 < 2) {
        local_4 = 0x7fffffff;
      }
      else {
        IVar11 = av1_hash_get_first_iterator
                           ((hash_table *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
        iVar12 = 0;
        while (iVar12 < iVar7) {
          puVar10 = (undefined8 *)aom_iterator_get((Iterator *)&stack0xffffffffffffff68);
          uVar2 = *puVar10;
          local_a4 = (short)uVar2;
          sStack_a2 = (short)((ulong)uVar2 >> 0x10);
          iVar9 = (int)((ulong)uVar2 >> 0x20);
          if ((in_stack_ffffffffffffff8c == iVar9) &&
             (iVar8 = av1_is_dv_valid(dv_00,(AV1_COMMON *)CONCAT44(iVar3,iVar5),
                                      (MACROBLOCKD *)CONCAT44(iVar6,in_stack_ffffffffffffff90),
                                      in_stack_ffffffffffffff8c,local_4,
                                      (BLOCK_SIZE)((ulong)p_hash_table >> 0x38),(int)hash_value2_00)
             , iVar8 != 0)) {
            local_ac.col = local_a4 - (short)iVar5;
            local_ac.row = sStack_a2 - (short)iVar6;
            iVar8 = av1_is_fullmv_in_range(mv_limits_00,local_ac);
            if ((iVar8 != 0) &&
               (iVar9 = get_mvpred_var_cost((FULLPEL_MOTION_SEARCH_PARAMS *)IVar11.element_size,
                                            (FULLPEL_MV *)IVar11.pointer,
                                            (FULLPEL_MV_STATS *)CONCAT44(iVar12,iVar9)),
               iVar9 < local_4)) {
              *(FULLPEL_MV *)in_R8->hash_value_buffer[0] = local_ac;
              local_4 = iVar9;
            }
          }
          iVar12 = iVar12 + 1;
          aom_iterator_increment((Iterator *)&stack0xffffffffffffff68);
        }
      }
    }
    else {
      local_4 = 0x7fffffff;
    }
  }
  return local_4;
}

Assistant:

int av1_intrabc_hash_search(const AV1_COMP *cpi, const MACROBLOCKD *xd,
                            const FULLPEL_MOTION_SEARCH_PARAMS *ms_params,
                            IntraBCHashInfo *intrabc_hash_info,
                            FULLPEL_MV *best_mv) {
  if (!av1_use_hash_me(cpi)) return INT_MAX;

  const BLOCK_SIZE bsize = ms_params->bsize;
  const int block_width = block_size_wide[bsize];
  const int block_height = block_size_high[bsize];

  if (block_width != block_height) return INT_MAX;

  const FullMvLimits *mv_limits = &ms_params->mv_limits;
  const MSBuffers *ms_buffer = &ms_params->ms_buffers;

  const uint8_t *src = ms_buffer->src->buf;
  const int src_stride = ms_buffer->src->stride;

  const int mi_row = xd->mi_row;
  const int mi_col = xd->mi_col;
  const int x_pos = mi_col * MI_SIZE;
  const int y_pos = mi_row * MI_SIZE;

  uint32_t hash_value1, hash_value2;
  int best_hash_cost = INT_MAX;

  // for the hashMap
  hash_table *ref_frame_hash = &intrabc_hash_info->intrabc_hash_table;

  av1_get_block_hash_value(intrabc_hash_info, src, src_stride, block_width,
                           &hash_value1, &hash_value2, is_cur_buf_hbd(xd));

  const int count = av1_hash_table_count(ref_frame_hash, hash_value1);
  if (count <= 1) {
    return INT_MAX;
  }

  Iterator iterator = av1_hash_get_first_iterator(ref_frame_hash, hash_value1);
  for (int i = 0; i < count; i++, aom_iterator_increment(&iterator)) {
    block_hash ref_block_hash = *(block_hash *)(aom_iterator_get(&iterator));
    if (hash_value2 == ref_block_hash.hash_value2) {
      // Make sure the prediction is from valid area.
      const MV dv = { GET_MV_SUBPEL(ref_block_hash.y - y_pos),
                      GET_MV_SUBPEL(ref_block_hash.x - x_pos) };
      if (!av1_is_dv_valid(dv, &cpi->common, xd, mi_row, mi_col, bsize,
                           cpi->common.seq_params->mib_size_log2))
        continue;

      FULLPEL_MV hash_mv;
      hash_mv.col = ref_block_hash.x - x_pos;
      hash_mv.row = ref_block_hash.y - y_pos;
      if (!av1_is_fullmv_in_range(mv_limits, hash_mv)) continue;
      FULLPEL_MV_STATS mv_stats;
      const int refCost = get_mvpred_var_cost(ms_params, &hash_mv, &mv_stats);
      if (refCost < best_hash_cost) {
        best_hash_cost = refCost;
        *best_mv = hash_mv;
      }
    }
  }

  return best_hash_cost;
}